

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

bool __thiscall position::gives_check(position *this,Move *m)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  unsigned_long *puVar7;
  byte bVar8;
  int iVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long *puVar13;
  bool bVar14;
  Color them;
  Color c;
  Square target;
  Color local_60;
  Color local_5c;
  long local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  Square local_34;
  
  local_5c = (this->ifo).stm;
  uVar12 = (ulong)local_5c;
  uVar4 = uVar12 ^ 1;
  local_60 = (Color)uVar4;
  bVar1 = m->type;
  uVar6 = (uint)(ushort)bVar1;
  if ((0xf < bVar1) || (bVar14 = true, (0x800fU >> (bVar1 & 0x1f) & 1) == 0)) {
    bVar14 = (bVar1 & 0xfc) == 4;
  }
  if ((uVar6 < 0xe) && ((0x2300U >> (uVar6 & 0x1f) & 1) != 0)) {
    if (uVar12 == 1) {
      uVar5 = 0x38;
      if (uVar6 == 8) {
        uVar5 = 0x3f;
      }
      bVar8 = (uVar6 == 8) * '\x02' + 0x3b;
    }
    else if (local_5c == white) {
      uVar5 = 7;
      if (bVar1 != 8) {
        uVar5 = 0;
      }
      bVar8 = (bVar1 == 8) * '\x02' + 3;
    }
    else {
      bVar8 = m->t;
      uVar5 = (ulong)m->f;
    }
    local_40 = (ulong)(this->pcs).piece_on._M_elems[m->f];
    uVar11 = (&bitboards::squares)[bVar8] | (&bitboards::squares)[uVar5];
    puVar7 = (this->pcs).bitmap._M_elems[uVar12]._M_elems + 3;
    bVar2 = true;
    puVar13 = puVar7;
  }
  else {
    uVar5 = (ulong)m->f;
    local_40 = (ulong)(this->pcs).piece_on._M_elems[uVar5];
    if (local_40 == 5) {
      return false;
    }
    bVar8 = m->t;
    uVar11 = ((&bitboards::squares)[bVar8] | (&bitboards::squares)[uVar5]) ^
             (this->pcs).bitmap._M_elems[uVar12]._M_elems[local_40];
    (this->pcs).bitmap._M_elems[uVar12]._M_elems[local_40] = uVar11;
    bVar2 = false;
    if (!bVar14) goto LAB_00121b50;
    puVar7 = &bitboards::squares + bVar8;
    puVar13 = (this->pcs).bitmap._M_elems[uVar12]._M_elems + local_40;
  }
  *puVar13 = uVar11 ^ *puVar7;
LAB_00121b50:
  bVar10 = uVar6 == 0xc | bVar1 < 0x11 & (byte)(0x108f0 >> (bVar1 & 0x1f));
  if (bVar10 == 1) {
    iVar9 = 0;
    if (uVar6 == 0xc) {
      iVar9 = (uint)(uVar12 != 0) * 0x10 + -8;
    }
    local_48 = (ulong)(iVar9 + (uint)bVar8);
    local_50 = (ulong)(this->pcs).piece_on._M_elems[local_48];
    puVar7 = (this->pcs).bitmap._M_elems[uVar4]._M_elems + local_50;
    *puVar7 = *puVar7 ^ (&bitboards::squares)[local_48];
  }
  else {
    local_50 = 7;
    local_48 = 0x41;
  }
  if (bVar14) {
    local_58 = 7;
    if ((bVar1 - 3 & 0xfb) == 0) {
      local_58 = 1;
    }
    if ((uVar6 | 4) == 6) {
      local_58 = 2;
    }
    if ((uVar6 | 4) == 5) {
      local_58 = 3;
    }
    if ((bVar1 & 0xfb) == 0) {
      local_58 = 4;
    }
    puVar7 = (this->pcs).bitmap._M_elems[uVar12]._M_elems + local_58;
    *puVar7 = *puVar7 | (&bitboards::squares)[bVar8];
  }
  else {
    local_58 = 7;
  }
  local_34 = (this->ifo).ks[uVar4];
  bVar3 = is_attacked(this,&local_34,&local_60,&local_5c,
                      ((this->pcs).bycolor._M_elems[1] | (this->pcs).bycolor._M_elems[0]) ^
                      (&bitboards::squares)[uVar5] | (&bitboards::squares)[bVar8]);
  uVar5 = (&bitboards::squares)[uVar5] | (&bitboards::squares)[bVar8];
  if (bVar2) {
    puVar7 = (this->pcs).bitmap._M_elems[uVar12]._M_elems + 3;
  }
  else {
    puVar7 = (this->pcs).bitmap._M_elems[uVar12]._M_elems + (local_40 & 0xffffffff);
    *puVar7 = *puVar7 ^ uVar5;
    if (bVar10 != 0) {
      puVar7 = (this->pcs).bitmap._M_elems[uVar4]._M_elems + local_50;
      *puVar7 = *puVar7 | (&bitboards::squares)[local_48];
    }
    if (!bVar14) {
      return bVar3;
    }
    uVar5 = (&bitboards::squares)[bVar8];
    puVar7 = (this->pcs).bitmap._M_elems[uVar12]._M_elems + local_58;
  }
  *puVar7 = *puVar7 ^ uVar5;
  return bVar3;
}

Assistant:

bool position::gives_check(const Move& m) {
	// Note: assumes the input move is legal (!)
	auto mask = 0ULL;
	auto c = to_move();
	auto them = Color(c ^ 1);
	auto isCapture = m.type == Movetype::capture ||
		m.type == Movetype::capture_promotion ||
		m.type == Movetype::capture_promotion_b ||
		m.type == Movetype::capture_promotion_n ||
		m.type == Movetype::capture_promotion_q ||
		m.type == Movetype::capture_promotion_r;
	auto isPromotion = is_promotion(m.type);
	auto isEp = m.type == Movetype::ep;
	auto isQuiet = m.type == Movetype::quiet;
	auto isCastles = m.type == Movetype::castles ||
		m.type == Movetype::castle_ks ||
		m.type == Movetype::castle_qs;
	auto from = m.f;
	auto to = m.t;
	auto capSq = Square::no_square;
	auto promotePiece = Piece::no_piece;
	auto piece = piece_on(Square(from));
	auto capPiece = Piece::no_piece;
	if (piece == king && !isCastles)
		return false;

	// Move our piece
	if (isCastles) {
		if (c == white) {
			to = (m.type == Movetype::castle_ks ? F1 : D1);
			from = (m.type == Movetype::castle_ks ? H1 : A1);
		}
		else if (c == black) {
			to = (m.type == Movetype::castle_ks ? F8 : D8);
			from = (m.type == Movetype::castle_ks ? H8 : A8);
		}
		pcs.bitmap[c][rook] ^= (bitboards::squares[from] | bitboards::squares[to]);
	}
	else {
		pcs.bitmap[c][piece] ^= (bitboards::squares[from] | bitboards::squares[to]);
		if (isPromotion)
			pcs.bitmap[c][piece] ^= bitboards::squares[to];
	}

	// Remove the captured piece
	if (isCapture || isEp) {
		if (isEp)
			capSq = Square(to + (c == white ? -8 : 8));
		else
			capSq = Square(to);

		capPiece = piece_on(Square(capSq));
		pcs.bitmap[them][capPiece] ^= bitboards::squares[capSq];
		mask ^= bitboards::squares[capSq];
	}

	// Add promotion piece
	if (isPromotion) {
		if (m.type == Movetype::capture_promotion_n || m.type == Movetype::promotion_n)
			promotePiece = knight;
		if (m.type == Movetype::capture_promotion_b || m.type == Movetype::promotion_b)
			promotePiece = bishop;
		if (m.type == Movetype::capture_promotion_r || m.type == Movetype::promotion_r)
			promotePiece = rook;
		if (m.type == Movetype::capture_promotion_q || m.type == Movetype::promotion_q)
			promotePiece = queen;
		pcs.bitmap[c][promotePiece] |= bitboards::squares[to];
	}

	// Make the check mask
	mask = (all_pieces() ^ bitboards::squares[from]) | bitboards::squares[to];

	auto target = king_square(them);
	auto checks = is_attacked(target, them, c, mask);

	// Reset the pcs bitmap
	if (isCastles) {
		pcs.bitmap[c][rook] ^= (bitboards::squares[to] | bitboards::squares[from]);
	}
	else {
		// Move our piece back
		pcs.bitmap[c][piece] ^= (bitboards::squares[to] | bitboards::squares[from]);

		// Place back the captured piece and remove promotion piece
		if (isCapture || isEp)
			pcs.bitmap[them][capPiece] |= bitboards::squares[capSq];
		if (isPromotion) {
			pcs.bitmap[c][promotePiece] ^= bitboards::squares[to];
		}
	}

	return checks;
}